

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O0

void __thiscall
slang::ast::NewCovergroupExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
          (NewCovergroupExpression *this,SampledValueExprVisitor *visitor)

{
  iterator ppEVar1;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  SampledValueExprVisitor *visitor_local;
  NewCovergroupExpression *this_local;
  
  __end3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
           begin(&this->arguments);
  ppEVar1 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            end(&this->arguments);
  for (; __end3 != ppEVar1; __end3 = __end3 + 1) {
    Expression::visit<slang::ast::SampledValueExprVisitor&>(*__end3,visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto arg : arguments)
            arg->visit(visitor);
    }